

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O1

int curl_strnequal(char *first,char *second,size_t max)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar3 = max != 0 && (first == (char *)0x0 && second == (char *)0x0);
  }
  else {
    bVar1 = *first;
    if (bVar1 != 0) {
      pbVar2 = (byte *)(first + 1);
      do {
        if (((ulong)(byte)*second == 0) || (max == 0)) break;
        if (""[bVar1] != ""[(byte)*second]) {
          bVar3 = false;
          goto LAB_0015ae21;
        }
        max = max - 1;
        second = (char *)((byte *)second + 1);
        bVar1 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      } while (bVar1 != 0);
    }
    if (max == 0) {
      bVar3 = true;
    }
    else {
      bVar3 = ""[bVar1] == ""[(byte)*second];
    }
  }
LAB_0015ae21:
  return (int)bVar3;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return ncasecompare(first, second, max);

  /* if both pointers are NULL then treat them as equal if max is non-zero */
  return (NULL == first && NULL == second && max);
}